

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O2

void __thiscall midi_event::midi_event(midi_event *this,midi_event *p_in)

{
  size_t __n;
  uint uVar1;
  
  (this->m_ext_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ext_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ext_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_timestamp = p_in->m_timestamp;
  uVar1 = p_in->m_channel;
  this->m_type = p_in->m_type;
  this->m_channel = uVar1;
  __n = p_in->m_data_count;
  this->m_data_count = __n;
  memcpy(this->m_data,p_in->m_data,__n);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->m_ext_data,&p_in->m_ext_data);
  return;
}

Assistant:

midi_event::midi_event( const midi_event & p_in )
{
    m_timestamp = p_in.m_timestamp;
    m_channel = p_in.m_channel;
    m_type = p_in.m_type;
    m_data_count = p_in.m_data_count;
    memcpy( m_data, p_in.m_data, m_data_count );
    m_ext_data = p_in.m_ext_data;
}